

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinearScan.cpp
# Opt level: O2

void __thiscall LinearScan::EndDeadOpHelperLifetimes(LinearScan *this,Instr *instr)

{
  uint uVar1;
  SList<Lifetime_*,_Memory::ArenaAllocator,_RealCount> *this_00;
  Type pLVar2;
  code *pcVar3;
  bool bVar4;
  ushort uVar5;
  uint32 uVar6;
  undefined4 *puVar7;
  Type *ppLVar8;
  
  bVar4 = SkipNumberedInstr(this,instr);
  if (!bVar4) {
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    while (this_00 = this->opHelperSpilledLiveranges,
          (SList<Lifetime_*,_Memory::ArenaAllocator,_RealCount> *)
          (this_00->super_SListBase<Lifetime_*,_Memory::ArenaAllocator,_RealCount>).
          super_SListNodeBase<Memory::ArenaAllocator>.next != this_00) {
      ppLVar8 = SListBase<Lifetime_*,_Memory::ArenaAllocator,_RealCount>::Head
                          (&this_00->super_SListBase<Lifetime_*,_Memory::ArenaAllocator,_RealCount>)
      ;
      uVar1 = (*ppLVar8)->end;
      uVar6 = IR::Instr::GetNumber(instr);
      if (uVar6 < uVar1) {
        return;
      }
      if (this->currentOpHelperBlock == (OpHelperBlock *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar7 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LinearScan.cpp"
                           ,0x989,"(this->IsInHelperBlock())","this->IsInHelperBlock()");
        if (!bVar4) {
          pcVar3 = (code *)invalidInstructionException();
          (*pcVar3)();
        }
        *puVar7 = 0;
      }
      ppLVar8 = SListBase<Lifetime_*,_Memory::ArenaAllocator,_RealCount>::Head
                          (&this->opHelperSpilledLiveranges->
                            super_SListBase<Lifetime_*,_Memory::ArenaAllocator,_RealCount>);
      pLVar2 = *ppLVar8;
      SList<Lifetime_*,_Memory::ArenaAllocator,_RealCount>::RemoveHead
                (this->opHelperSpilledLiveranges);
      uVar5 = *(ushort *)&pLVar2->field_0x9c;
      if ((uVar5 & 0x40) == 0) {
        BVUnitT<unsigned_long>::Clear(&this->opHelperSpilledRegs,(uint)pLVar2->reg);
        uVar5 = *(ushort *)&pLVar2->field_0x9c;
      }
      *(ushort *)&pLVar2->field_0x9c = uVar5 & 0xff8f;
    }
  }
  return;
}

Assistant:

void
LinearScan::EndDeadOpHelperLifetimes(IR::Instr * instr)
{
    if (this->SkipNumberedInstr(instr))
    {
        return;
    }

    while (!this->opHelperSpilledLiveranges->Empty() &&
           this->opHelperSpilledLiveranges->Head()->end <= instr->GetNumber())
    {
        Lifetime * deadLifetime;

        // The lifetime doesn't extend beyond the helper block
        // No need to save and restore around the helper block
        Assert(this->IsInHelperBlock());

        deadLifetime = this->opHelperSpilledLiveranges->Head();
        this->opHelperSpilledLiveranges->RemoveHead();
        if (!deadLifetime->cantOpHelperSpill)
        {
            this->opHelperSpilledRegs.Clear(deadLifetime->reg);
        }
        deadLifetime->isOpHelperSpilled = false;
        deadLifetime->cantOpHelperSpill = false;
        deadLifetime->isOpHelperSpillAsArg = false;
    }
}